

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void duckdb::QuantileOperation::
     Operation<signed_char,duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
               (QuantileState<signed_char,_duckdb::QuantileStandardType> *state,char *input,
               AggregateUnaryInput *aggr_input)

{
  AggregateInputData *in_RSI;
  undefined8 in_RDI;
  
  QuantileState<signed_char,_duckdb::QuantileStandardType>::AddElement
            ((QuantileState<signed_char,_duckdb::QuantileStandardType> *)aggr_input,
             (char)((ulong)in_RDI >> 0x38),in_RSI);
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &aggr_input) {
		state.AddElement(input, aggr_input.input);
	}